

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_fe241b::VectorVarTestBase::SetUp(VectorVarTestBase *this)

{
  bool bVar1;
  void *pvVar2;
  ACMRandom *this_00;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int in_stack_ffffffffffffff6c;
  AssertHelper *in_stack_ffffffffffffff70;
  short **in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  Type in_stack_ffffffffffffff9c;
  AssertHelper *in_stack_ffffffffffffffa0;
  AssertHelper *this_01;
  AssertionResult local_58;
  uint local_44;
  undefined8 local_20;
  Message *in_stack_ffffffffffffffe8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffff0;
  
  *(int *)(in_RDI + 0x10) = 4 << ((byte)*(undefined4 *)(in_RDI + 0x14) & 0x1f);
  pvVar2 = aom_memalign((size_t)in_RDI,(size_t)in_stack_ffffffffffffff80);
  *(void **)(in_RDI + 0x18) = pvVar2;
  local_20 = 0;
  testing::internal::CmpHelperNE<short*,decltype(nullptr)>
            (in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             &in_stack_ffffffffffffff70->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff80 =
         testing::AssertionResult::failure_message((AssertionResult *)0xa48ae3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffff0._M_head_impl,in_stack_ffffffffffffffe8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff70);
    testing::Message::~Message((Message *)0xa48b31);
  }
  local_44 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa48b9a);
  if (local_44 == 0) {
    pvVar2 = aom_memalign((size_t)in_RDI,(size_t)in_stack_ffffffffffffff80);
    *(void **)(in_RDI + 0x20) = pvVar2;
    this_01 = (AssertHelper *)0x0;
    testing::internal::CmpHelperNE<short*,decltype(nullptr)>
              (in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               &in_stack_ffffffffffffff70->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
    if (!bVar1) {
      testing::Message::Message((Message *)this_01);
      testing::AssertionResult::failure_message((AssertionResult *)0xa48c2f);
      testing::internal::AssertHelper::AssertHelper
                (this_01,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,
                 (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff80);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffff0._M_head_impl,in_stack_ffffffffffffffe8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff70);
      testing::Message::~Message((Message *)0xa48c7d);
    }
    local_44 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xa48cdd);
    if (local_44 == 0) {
      this_00 = (ACMRandom *)(in_RDI + 0x28);
      libaom_test::ACMRandom::DeterministicSeed();
      libaom_test::ACMRandom::Reset(this_00,in_stack_ffffffffffffff6c);
    }
  }
  return;
}

Assistant:

void SetUp() override {
    width = 4 << m_bwl;

    ref_vector = static_cast<int16_t *>(
        aom_memalign(kDataAlignment, width * sizeof(ref_vector[0])));
    ASSERT_NE(ref_vector, nullptr);
    src_vector = static_cast<int16_t *>(
        aom_memalign(kDataAlignment, width * sizeof(src_vector[0])));
    ASSERT_NE(src_vector, nullptr);

    rnd_.Reset(ACMRandom::DeterministicSeed());
  }